

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktClippingTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::clipping::anon_unknown_0::ClipDistance::testClipDistance
          (TestStatus *__return_storage_ptr__,ClipDistance *this,Context *context,
          CaseDefinition caseDef)

{
  ostringstream *this_00;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var1;
  uint uVar2;
  FeatureFlags flags;
  Context *pCVar3;
  Context *pCVar4;
  int iVar5;
  int iVar6;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  const_iterator cVar7;
  TestLog *pTVar8;
  TestStatus *pTVar9;
  ulong uVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  int i;
  int iVar12;
  float fVar13;
  float fVar14;
  vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> shaders;
  IVec2 clipRegion;
  VulkanProgram vulkanProgram;
  DrawCallData drawCallData;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> vertices;
  VulkanDrawContext drawContext;
  DrawState drawState;
  vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_> local_758;
  TestStatus *local_740;
  Context *local_738;
  ulong local_730;
  Context *local_728;
  ulong local_720;
  Vec4 local_718;
  ulong local_708;
  VulkanProgram local_700;
  DrawCallData local_6f8;
  IVec2 local_6f0;
  void *local_6e8;
  undefined8 uStack_6e0;
  long local_6d8;
  undefined1 local_6d0 [16];
  int local_6c0;
  undefined8 local_6bc;
  int local_6b4;
  void *local_6b0;
  Vec4 local_6a8;
  IVec2 local_698;
  undefined1 local_690 [8];
  ProgramBinary *pPStack_688;
  int local_680;
  int iStack_67c;
  int iStack_678;
  int local_674;
  void *local_670;
  ios_base local_618 [264];
  undefined1 local_510 [8];
  float local_508;
  float fStack_504;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_500 [6];
  ios_base local_498 [604];
  uint local_23c;
  uint local_238;
  uint local_234;
  ConstPixelBufferAccess local_1d8;
  undefined1 local_1b0 [384];
  
  uVar10 = caseDef._0_8_;
  local_740 = __return_storage_ptr__;
  vk = Context::getInstanceInterface((Context *)this);
  local_738 = (Context *)this;
  physicalDevice = Context::getPhysicalDevice((Context *)this);
  ::vk::getPhysicalDeviceProperties((VkPhysicalDeviceProperties *)local_510,vk,physicalDevice);
  iVar5 = (uint)(0 < (int)caseDef.topology) * 0x200;
  iVar12 = iVar5 + 0x400;
  if (caseDef._4_4_ == 0 || (long)uVar10 < 0) {
    iVar12 = iVar5;
  }
  local_730 = (ulong)context & 0x10000000000;
  uVar2 = (uint)(local_730 >> 0x20);
  flags = iVar12 + 2 + (uVar2 >> 8);
  if (((ulong)context >> 0x30 & 1) == 0) {
    flags = iVar12 + (uVar2 >> 8);
  }
  local_728 = context;
  local_720 = uVar10 >> 0x20;
  requireFeatures(vk,physicalDevice,flags);
  pCVar3 = local_738;
  local_708 = uVar10;
  if (((int)caseDef.topology < 1) || (7 < local_23c)) {
    if (((int)local_720 < 1) || (7 < local_238)) {
      if (((int)local_720 < 1) || (7 < local_234)) {
        local_758.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_758.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
        _M_impl.super__Vector_impl_data._M_finish = (Shader *)0x0;
        local_758.super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (Shader *)0x0;
        p_Var1 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                  *)local_738->m_progCollection;
        local_510 = (undefined1  [8])local_500;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_510,"vert","");
        cVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                ::find(p_Var1,(key_type *)local_510);
        pCVar4 = local_728;
        pPStack_688 = *(ProgramBinary **)(cVar7._M_node + 2);
        local_690._0_4_ = VK_SHADER_STAGE_VERTEX_BIT;
        if (local_758.
            super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_758.
            super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::
          _M_realloc_insert<vkt::drawutil::Shader>
                    (&local_758,
                     (iterator)
                     local_758.
                     super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(Shader *)local_690);
        }
        else {
          *(undefined1 (*) [8])
           local_758.
           super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>._M_impl
           .super__Vector_impl_data._M_finish = local_690;
          (local_758.
           super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>._M_impl
           .super__Vector_impl_data._M_finish)->binary = pPStack_688;
          local_758.
          super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_758.
               super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        if (local_510 != (undefined1  [8])local_500) {
          operator_delete((void *)local_510,local_500[0]._M_allocated_capacity + 1);
        }
        p_Var1 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                  *)pCVar3->m_progCollection;
        local_510 = (undefined1  [8])local_500;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_510,"frag","");
        cVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                ::find(p_Var1,(key_type *)local_510);
        pPStack_688 = *(ProgramBinary **)(cVar7._M_node + 2);
        local_690._0_4_ = VK_SHADER_STAGE_FRAGMENT_BIT;
        if (local_758.
            super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_758.
            super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::
          _M_realloc_insert<vkt::drawutil::Shader>
                    (&local_758,
                     (iterator)
                     local_758.
                     super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(Shader *)local_690);
        }
        else {
          *(undefined1 (*) [8])
           local_758.
           super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>._M_impl
           .super__Vector_impl_data._M_finish = local_690;
          (local_758.
           super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>._M_impl
           .super__Vector_impl_data._M_finish)->binary = pPStack_688;
          local_758.
          super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_758.
               super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        if (local_510 != (undefined1  [8])local_500) {
          operator_delete((void *)local_510,local_500[0]._M_allocated_capacity + 1);
        }
        if (local_730 != 0) {
          p_Var1 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                    *)pCVar3->m_progCollection;
          local_510 = (undefined1  [8])local_500;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_510,"tesc","");
          cVar7 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                  ::find(p_Var1,(key_type *)local_510);
          pPStack_688 = *(ProgramBinary **)(cVar7._M_node + 2);
          local_690._0_4_ = VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT;
          if (local_758.
              super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_758.
              super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::
            _M_realloc_insert<vkt::drawutil::Shader>
                      (&local_758,
                       (iterator)
                       local_758.
                       super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(Shader *)local_690);
          }
          else {
            *(undefined1 (*) [8])
             local_758.
             super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
             _M_impl.super__Vector_impl_data._M_finish = local_690;
            (local_758.
             super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
             _M_impl.super__Vector_impl_data._M_finish)->binary = pPStack_688;
            local_758.
            super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_758.
                 super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          if (local_510 != (undefined1  [8])local_500) {
            operator_delete((void *)local_510,local_500[0]._M_allocated_capacity + 1);
          }
          p_Var1 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                    *)pCVar3->m_progCollection;
          local_510 = (undefined1  [8])local_500;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_510,"tese","");
          cVar7 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                  ::find(p_Var1,(key_type *)local_510);
          pPStack_688 = *(ProgramBinary **)(cVar7._M_node + 2);
          local_690._0_4_ = VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT;
          if (local_758.
              super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_758.
              super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::
            _M_realloc_insert<vkt::drawutil::Shader>
                      (&local_758,
                       (iterator)
                       local_758.
                       super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(Shader *)local_690);
          }
          else {
            *(undefined1 (*) [8])
             local_758.
             super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
             _M_impl.super__Vector_impl_data._M_finish = local_690;
            (local_758.
             super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
             _M_impl.super__Vector_impl_data._M_finish)->binary = pPStack_688;
            local_758.
            super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_758.
                 super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          if (local_510 != (undefined1  [8])local_500) {
            operator_delete((void *)local_510,local_500[0]._M_allocated_capacity + 1);
          }
        }
        if (((ulong)pCVar4 >> 0x30 & 1) != 0) {
          p_Var1 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                    *)pCVar3->m_progCollection;
          local_510 = (undefined1  [8])local_500;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_510,"geom","");
          cVar7 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                  ::find(p_Var1,(key_type *)local_510);
          pPStack_688 = *(ProgramBinary **)(cVar7._M_node + 2);
          local_690._0_4_ = VK_SHADER_STAGE_GEOMETRY_BIT;
          if (local_758.
              super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_758.
              super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>::
            _M_realloc_insert<vkt::drawutil::Shader>
                      (&local_758,
                       (iterator)
                       local_758.
                       super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(Shader *)local_690);
          }
          else {
            *(undefined1 (*) [8])
             local_758.
             super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
             _M_impl.super__Vector_impl_data._M_finish = local_690;
            (local_758.
             super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
             _M_impl.super__Vector_impl_data._M_finish)->binary = pPStack_688;
            local_758.
            super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_758.
                 super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
          if (local_510 != (undefined1  [8])local_500) {
            operator_delete((void *)local_510,local_500[0]._M_allocated_capacity + 1);
          }
        }
        local_6e8 = (void *)0x0;
        uStack_6e0 = 0;
        local_6d8 = 0;
        iVar12 = 0;
        do {
          fVar13 = (float)iVar12 * 0.25 + -1.0;
          local_510._4_4_ = -1.0;
          local_508 = 0.0;
          fStack_504 = 1.0;
          local_510._0_4_ = fVar13;
          std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
          emplace_back<tcu::Vector<float,4>>
                    ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_6e8
                     ,(Vector<float,_4> *)local_510);
          local_510._4_4_ = 1.0;
          local_508 = 0.0;
          fStack_504 = 1.0;
          local_510._0_4_ = fVar13;
          std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
          emplace_back<tcu::Vector<float,4>>
                    ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_6e8
                     ,(Vector<float,_4> *)local_510);
          fVar14 = fVar13 + 0.25;
          local_510._4_4_ = -1.0;
          local_508 = 0.0;
          fStack_504 = 1.0;
          local_510._0_4_ = fVar14;
          std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
          emplace_back<tcu::Vector<float,4>>
                    ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_6e8
                     ,(Vector<float,_4> *)local_510);
          local_510._4_4_ = 1.0;
          local_508 = 0.0;
          fStack_504 = 1.0;
          local_510._0_4_ = fVar13;
          std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
          emplace_back<tcu::Vector<float,4>>
                    ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_6e8
                     ,(Vector<float,_4> *)local_510);
          local_510._4_4_ = 1.0;
          local_508 = 0.0;
          fStack_504 = 1.0;
          local_510._0_4_ = fVar14;
          std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
          emplace_back<tcu::Vector<float,4>>
                    ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_6e8
                     ,(Vector<float,_4> *)local_510);
          local_510._4_4_ = -1.0;
          local_508 = 0.0;
          fStack_504 = 1.0;
          local_510._0_4_ = fVar14;
          std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
          emplace_back<tcu::Vector<float,4>>
                    ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_6e8
                     ,(Vector<float,_4> *)local_510);
          iVar12 = iVar12 + 1;
        } while (iVar12 != 8);
        local_1b0._0_8_ = local_738->m_testCtx->m_log;
        this_00 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Drawing ",8);
        uVar10 = local_708;
        std::ostream::operator<<(this_00,8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00," colored bars, clipping the first ",0x22);
        iVar12 = (int)uVar10;
        std::ostream::operator<<(this_00,iVar12);
        local_690 = (undefined1  [8])
                    tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_1b0,
                               (EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&pPStack_688);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pPStack_688,"Using ",6);
        std::ostream::operator<<((ostringstream *)&pPStack_688,iVar12);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pPStack_688," ClipDistance(s) and ",0x15);
        std::ostream::operator<<((ostringstream *)&pPStack_688,(int)local_720);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&pPStack_688," CullDistance(s)",0x10);
        pTVar8 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_690,(EndMessageToken *)&tcu::TestLog::EndMessage
                           );
        local_510._0_4_ = SUB84(pTVar8,0);
        local_510._4_4_ = (undefined4)((ulong)pTVar8 >> 0x20);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_508);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_508,"Expecting upper half of the clipped bars to be black.",
                   0x35);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_510,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_508);
        std::ios_base::~ios_base(local_498);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pPStack_688);
        std::ios_base::~ios_base(local_618);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
        drawutil::DrawState::DrawState
                  ((DrawState *)local_1b0,(VkPrimitiveTopology)local_728,0x10,0x10);
        pTVar9 = local_740;
        local_700.shaders = &local_758;
        if (local_730 != 0) {
          local_1b0._24_4_ = 3;
        }
        local_6f8.vertices =
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&local_6e8;
        drawutil::VulkanDrawContext::VulkanDrawContext
                  ((VulkanDrawContext *)local_510,local_738,(DrawState *)local_1b0,&local_6f8,
                   &local_700);
        drawutil::VulkanDrawContext::draw((VulkanDrawContext *)local_510);
        drawutil::VulkanDrawContext::getColorPixels
                  ((ConstPixelBufferAccess *)local_6d0,(VulkanDrawContext *)local_510);
        local_6a8.m_data[0] = 0.0;
        local_6a8.m_data[1] = 0.0;
        local_6a8.m_data[2] = 0.0;
        local_6a8.m_data[3] = 1.0;
        local_718.m_data[0] = 0.0;
        local_718.m_data[1] = 0.0;
        local_718.m_data[2] = 0.0;
        local_718.m_data[3] = 0.0;
        local_690 = (undefined1  [8])local_6d0._0_8_;
        pPStack_688 = (ProgramBinary *)local_6d0._8_8_;
        local_680 = local_6c0;
        iStack_67c = (int)local_6bc;
        iStack_678 = SUB84(local_6bc,4);
        local_674 = local_6b4;
        local_670 = local_6b0;
        local_6f0.m_data[0] = 0;
        local_6f0.m_data[1] = 0;
        local_698.m_data[0] = local_6d0._8_4_;
        local_698.m_data[1] = local_6d0._12_4_;
        iVar5 = countPixels((ConstPixelBufferAccess *)local_690,&local_6f0,&local_698,&local_6a8,
                            &local_718);
        local_718.m_data[1] = 1.12104e-44;
        local_718.m_data[0] = (float)((iVar12 << 4) >> 3);
        drawutil::VulkanDrawContext::getColorPixels(&local_1d8,(VulkanDrawContext *)local_510);
        local_6f0.m_data[0] = 0;
        local_6f0.m_data[1] = 8;
        local_690._0_4_ = R;
        local_690._4_4_ = SNORM_INT8;
        pPStack_688 = (ProgramBinary *)0x3f80000000000000;
        local_6a8.m_data[0] = 0.0;
        local_6a8.m_data[1] = 0.0;
        local_6a8.m_data[2] = 0.0;
        local_6a8.m_data[3] = 0.0;
        iVar6 = countPixels(&local_1d8,&local_6f0,(IVec2 *)&local_718,(Vec4 *)local_690,&local_6a8);
        local_690 = (undefined1  [8])&local_680;
        if (iVar5 == iVar12 << 4 && iVar6 == 0) {
          std::__cxx11::string::_M_construct<char_const*>((string *)local_690,"OK","");
          pTVar9->m_code = QP_TEST_RESULT_PASS;
          (pTVar9->m_description)._M_dataplus._M_p = (pointer)&(pTVar9->m_description).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&pTVar9->m_description,local_690,
                     (long)&pPStack_688->m_format + (long)local_690);
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_690,"Rendered image(s) are incorrect","");
          pTVar9->m_code = QP_TEST_RESULT_FAIL;
          (pTVar9->m_description)._M_dataplus._M_p = (pointer)&(pTVar9->m_description).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&pTVar9->m_description,local_690,
                     (long)&pPStack_688->m_format + (long)local_690);
        }
        if (local_690 != (undefined1  [8])&local_680) {
          operator_delete((void *)local_690,CONCAT44(iStack_67c,local_680) + 1);
        }
        drawutil::VulkanDrawContext::~VulkanDrawContext((VulkanDrawContext *)local_510);
        if (local_6e8 != (void *)0x0) {
          operator_delete(local_6e8,local_6d8 - (long)local_6e8);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_758.
               super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>.
               _M_impl.super__Vector_impl_data._M_start ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          return pTVar9;
        }
        uVar10 = (long)local_758.
                       super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                 (long)local_758.
                       super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_758.
                     super__Vector_base<vkt::drawutil::Shader,_std::allocator<vkt::drawutil::Shader>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        goto LAB_003e7826;
      }
      local_510 = (undefined1  [8])local_500;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_510,
                 "maxCombinedClipAndCullDistances smaller than the minimum required by the spec","")
      ;
      pTVar9 = local_740;
      local_740->m_code = QP_TEST_RESULT_FAIL;
      (local_740->m_description)._M_dataplus._M_p = (pointer)&(local_740->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_740->m_description,local_510,
                 (char *)((long)local_510 + CONCAT44(fStack_504,local_508)));
    }
    else {
      local_510 = (undefined1  [8])local_500;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_510,
                 "maxCullDistances smaller than the minimum required by the spec","");
      pTVar9 = local_740;
      local_740->m_code = QP_TEST_RESULT_FAIL;
      (local_740->m_description)._M_dataplus._M_p = (pointer)&(local_740->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_740->m_description,local_510,
                 (char *)((long)local_510 + CONCAT44(fStack_504,local_508)));
    }
  }
  else {
    local_510 = (undefined1  [8])local_500;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_510,"maxClipDistances smaller than the minimum required by the spec",
               "");
    pTVar9 = local_740;
    local_740->m_code = QP_TEST_RESULT_FAIL;
    (local_740->m_description)._M_dataplus._M_p = (pointer)&(local_740->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_740->m_description,local_510,
               (char *)((long)local_510 + CONCAT44(fStack_504,local_508)));
  }
  if (local_510 == (undefined1  [8])local_500) {
    return pTVar9;
  }
  uVar10 = local_500[0]._M_allocated_capacity + 1;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_510;
LAB_003e7826:
  operator_delete(paVar11,uVar10);
  return pTVar9;
}

Assistant:

tcu::TestStatus testClipDistance (Context& context, const CaseDefinition caseDef)
{
	// Check test requirements
	{
		const InstanceInterface&		vki			= context.getInstanceInterface();
		const VkPhysicalDevice			physDevice	= context.getPhysicalDevice();
		const VkPhysicalDeviceLimits	limits		= getPhysicalDeviceProperties(vki, physDevice).limits;

		FeatureFlags requirements = (FeatureFlags)0;

		if (caseDef.numClipDistances > 0)
			requirements |= FEATURE_SHADER_CLIP_DISTANCE;
		if (caseDef.numCullDistances > 0)
			requirements |= FEATURE_SHADER_CULL_DISTANCE;
		if (caseDef.enableTessellation)
			requirements |= FEATURE_TESSELLATION_SHADER;
		if (caseDef.enableGeometry)
			requirements |= FEATURE_GEOMETRY_SHADER;

		requireFeatures(vki, physDevice, requirements);

		// Check limits for supported features

		if (caseDef.numClipDistances > 0 && limits.maxClipDistances < MAX_CLIP_DISTANCES)
			return tcu::TestStatus::fail("maxClipDistances smaller than the minimum required by the spec");
		if (caseDef.numCullDistances > 0 && limits.maxCullDistances < MAX_CULL_DISTANCES)
			return tcu::TestStatus::fail("maxCullDistances smaller than the minimum required by the spec");
		if (caseDef.numCullDistances > 0 && limits.maxCombinedClipAndCullDistances < MAX_COMBINED_CLIP_AND_CULL_DISTANCES)
			return tcu::TestStatus::fail("maxCombinedClipAndCullDistances smaller than the minimum required by the spec");
	}

	std::vector<Shader> shaders;
	shaders.push_back(Shader(VK_SHADER_STAGE_VERTEX_BIT,	context.getBinaryCollection().get("vert")));
	shaders.push_back(Shader(VK_SHADER_STAGE_FRAGMENT_BIT,	context.getBinaryCollection().get("frag")));
	if (caseDef.enableTessellation)
	{
		shaders.push_back(Shader(VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,		context.getBinaryCollection().get("tesc")));
		shaders.push_back(Shader(VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,	context.getBinaryCollection().get("tese")));
	}
	if (caseDef.enableGeometry)
		shaders.push_back(Shader(VK_SHADER_STAGE_GEOMETRY_BIT,	context.getBinaryCollection().get("geom")));

	const int numBars = MAX_COMBINED_CLIP_AND_CULL_DISTANCES;

	std::vector<Vec4> vertices;
	{
		const float	dx = 2.0f / numBars;
		for (int i = 0; i < numBars; ++i)
		{
			const float x = -1.0f + dx * static_cast<float>(i);

			vertices.push_back(Vec4(x,      -1.0f, 0.0f, 1.0f));
			vertices.push_back(Vec4(x,       1.0f, 0.0f, 1.0f));
			vertices.push_back(Vec4(x + dx, -1.0f, 0.0f, 1.0f));

			vertices.push_back(Vec4(x,       1.0f, 0.0f, 1.0f));
			vertices.push_back(Vec4(x + dx,  1.0f, 0.0f, 1.0f));
			vertices.push_back(Vec4(x + dx, -1.0f, 0.0f, 1.0f));
		}
	}

	tcu::TestLog& log = context.getTestContext().getLog();

	log << tcu::TestLog::Message << "Drawing " << numBars << " colored bars, clipping the first " << caseDef.numClipDistances << tcu::TestLog::EndMessage
		<< tcu::TestLog::Message << "Using " << caseDef.numClipDistances << " ClipDistance(s) and " << caseDef.numCullDistances << " CullDistance(s)" << tcu::TestLog::EndMessage
		<< tcu::TestLog::Message << "Expecting upper half of the clipped bars to be black." << tcu::TestLog::EndMessage;

	DrawState			drawState		(caseDef.topology, RENDER_SIZE, RENDER_SIZE);
	DrawCallData		drawCallData	(vertices);
	VulkanProgram		vulkanProgram	(shaders);

	if (caseDef.enableTessellation)
		drawState.numPatchControlPoints = NUM_PATCH_CONTROL_POINTS;

	VulkanDrawContext	drawContext(context, drawState, drawCallData, vulkanProgram);
	drawContext.draw();

	// Count black pixels in the whole image.
	const int numBlackPixels		= countPixels(drawContext.getColorPixels(), Vec4(0.0f, 0.0f, 0.0f, 1.0f), Vec4());
	const IVec2	clipRegion			= IVec2(caseDef.numClipDistances * RENDER_SIZE / numBars, RENDER_SIZE / 2);
	const int expectedClippedPixels	= clipRegion.x() * clipRegion.y();
	// Make sure the bottom half has no black pixels (possible if image became corrupted).
	const int guardPixels			= countPixels(drawContext.getColorPixels(), IVec2(0, RENDER_SIZE/2), clipRegion, Vec4(0.0f, 0.0f, 0.0f, 1.0f), Vec4());

	return (numBlackPixels == expectedClippedPixels && guardPixels == 0 ? tcu::TestStatus::pass("OK")
																		: tcu::TestStatus::fail("Rendered image(s) are incorrect"));
}